

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.hpp
# Opt level: O0

Resource * __thiscall
Diligent::ShaderResourceCacheVk::DescriptorSet::GetResource(DescriptorSet *this,Uint32 CacheOffset)

{
  Char *Message;
  char (*in_R8) [17];
  undefined1 local_38 [8];
  string msg;
  Uint32 CacheOffset_local;
  DescriptorSet *this_local;
  
  msg.field_2._12_4_ = CacheOffset;
  if (this->m_NumResources <= CacheOffset) {
    FormatString<char[8],unsigned_int,char[17]>
              ((string *)local_38,(Diligent *)"Offset ",(char (*) [8])((long)&msg.field_2 + 0xc),
               (uint *)0xc24e72,in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderResourceCacheVk.hpp"
               ,0xa1);
    std::__cxx11::string::~string((string *)local_38);
  }
  return this->m_pResources + (uint)msg.field_2._12_4_;
}

Assistant:

const Resource& GetResource(Uint32 CacheOffset) const
        {
            VERIFY(CacheOffset < m_NumResources, "Offset ", CacheOffset, " is out of range");
            return m_pResources[CacheOffset];
        }